

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O2

void JitFFI::OpCode_x64::movlps(JitFuncCreater *jfc,Register dst,Register src)

{
  byte bVar1;
  
  if (((dst & ~r15) == xmm0) && ((src & ~r15) == prax)) {
    bVar1 = (byte)dst >> 1 & 4 | (byte)src >> 3 & 1;
    if (bVar1 != 0) {
      JitFuncCreater::push(jfc,bVar1 | 0x40);
    }
    JitFuncCreater::push(jfc,'\x0f','\x12');
    mov_rx_prx_base(jfc,dst,src);
    return;
  }
  __assert_fail("is_xmmx(dst) && is_prx(src)",
                "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/include/opcode.h"
                ,0x1a4,"void JitFFI::OpCode_x64::movlps(JitFuncCreater &, Register, Register)");
}

Assistant:

inline bool is_xmmx(Register r) { return xmm0 <= r && r <= xmm15; }